

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crt_abstractions.c
# Opt level: O1

float strtof_s(char *nptr,char **endptr)

{
  FLOAT_STRING_TYPE FVar1;
  int *piVar2;
  float fVar3;
  double dVar4;
  int signal;
  char *runner;
  int exponential;
  double fraction;
  int local_34;
  double local_30;
  char *local_28;
  int local_1c;
  double local_18;
  
  local_34 = 1;
  fVar3 = 0.0;
  local_28 = nptr;
  if (nptr == (char *)0x0) goto LAB_00107720;
  FVar1 = splitFloatString(nptr,&local_28,&local_34,&local_18,&local_1c);
  switch(FVar1) {
  case FST_INFINITY:
    local_30 = (double)CONCAT44(local_30._4_4_,(float)local_34 * INFINITY);
    piVar2 = __errno_location();
    *piVar2 = 0;
    fVar3 = local_30._0_4_;
    break;
  case FST_NAN:
    fVar3 = NAN;
    break;
  case FST_NUMBER:
    local_30 = local_18;
    dVar4 = pow(10.0,(double)local_1c);
    dVar4 = (double)local_34 * dVar4 * local_30;
    if (ABS(dVar4) <= 3.4028234663852886e+38) {
      fVar3 = (float)dVar4;
      break;
    }
    goto LAB_001076e4;
  case FST_OVERFLOW:
LAB_001076e4:
    local_30 = (double)CONCAT44(local_30._4_4_,(float)local_34 * INFINITY);
    piVar2 = __errno_location();
    *piVar2 = 0x22;
    fVar3 = local_30._0_4_;
    break;
  default:
    fVar3 = 0.0;
    local_28 = nptr;
  }
LAB_00107720:
  if (endptr != (char **)0x0) {
    *endptr = local_28;
  }
  return fVar3;
}

Assistant:

float strtof_s(const char* nptr, char** endptr)
{
    int signal = 1;
    double fraction;
    int exponential;
    char* runner = (char*)nptr;
    double val;

    /*Codes_SRS_CRT_ABSTRACTIONS_21_021: [If no conversion could be performed, the strtof_s returns the value 0.0.]*/
    float result = 0.0;

    /*Codes_SRS_CRT_ABSTRACTIONS_21_036: [**If the nptr is NULL, the strtof_s must not perform any conversion and must returns 0.0f; endptr must receive NULL, provided that endptr is not a NULL pointer.]*/
    if (nptr != NULL)
    {
        switch (splitFloatString(nptr, &runner, &signal, &fraction, &exponential))
        {
        case FST_INFINITY:
            /*Codes_SRS_CRT_ABSTRACTIONS_21_023: [If the string is 'INF' of 'INFINITY' (ignoring case), the strtof_s must return the INFINITY value for float.]*/
            result = INFINITY * (signal);
            errno = 0;
            break;
        case FST_NAN:
            /*Codes_SRS_CRT_ABSTRACTIONS_21_024: [If the string is 'NAN' or 'NAN(...)' (ignoring case), the strtof_s must return 0.0f and points endptr to the first character after the 'NAN' sequence.]*/
            result = NAN;
            break;
        case FST_NUMBER:
            val = fraction * pow((double)10.0, (double)exponential) * (double)signal;
            if ((val >= ((double)FLT_MAX * (-1.0))) && (val <= (double)FLT_MAX))
            {
                /*Codes_SRS_CRT_ABSTRACTIONS_21_016: [The strtof_s must return the float that represents the value in the initial part of the string. If any.]*/
                result = (float)val;
            }
            else
            {
                /*Codes_SRS_CRT_ABSTRACTIONS_21_022: [If the correct value is outside the range, the strtof_s returns the value plus or minus HUGE_VALF, and errno will receive the value ERANGE.]*/
                result = HUGE_VALF * (signal);
                errno = ERANGE;
            }
            break;
        case FST_OVERFLOW:
            /*Codes_SRS_CRT_ABSTRACTIONS_21_022: [If the correct value is outside the range, the strtof_s returns the value plus or minus HUGE_VALF, and errno will receive the value ERANGE.]*/
            result = HUGE_VALF * (signal);
            errno = ERANGE;
            break;
        default:
            /*Codes_SRS_CRT_ABSTRACTIONS_21_020: [If the subject sequence is empty or does not have the expected form, the strtof_s must not perform any conversion and must returns 0.0f; the value of nptr is stored in the object pointed to by endptr, provided that endptr is not a NULL pointer.]*/
            runner = (char*)nptr;
            break;
        }
    }

    /*Codes_SRS_CRT_ABSTRACTIONS_21_017: [The strtof_s must return in endptr a final string of one or more unrecognized characters, including the terminating null character of the input string.]*/
    if (endptr != NULL)
    {
        (*endptr) = runner;
    }

    return result;
}